

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

shared_ptr<MPL::ModelPackageItemInfo> __thiscall
MPL::detail::ModelPackageImpl::findItem(ModelPackageImpl *this,string *identifier)

{
  char *pcVar1;
  bool bVar2;
  pointer pJVar3;
  __uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true> in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<MPL::ModelPackageItemInfo> sVar4;
  undefined1 local_1c0 [24];
  string local_1a8;
  undefined1 local_188 [8];
  string description;
  string local_160;
  undefined1 local_140 [8];
  string author;
  string local_118;
  undefined1 local_f8 [8];
  string name;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  path local_80;
  undefined1 local_58 [8];
  path path;
  undefined1 local_28 [8];
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  string *identifier_local;
  ModelPackageImpl *this_local;
  
  itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
  super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl =
       (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)
       (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)
       in_RDX.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
       super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
       super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  getItemInfoEntry((ModelPackageImpl *)local_28,identifier);
  bVar2 = std::operator==((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_28,
                          (nullptr_t)0x0);
  if (bVar2) {
    std::shared_ptr<MPL::ModelPackageItemInfo>::shared_ptr
              ((shared_ptr<MPL::ModelPackageItemInfo> *)this,(nullptr_t)0x0);
    path._36_4_ = 1;
  }
  else {
    pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                       ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_28);
    pcVar1 = kModelPackageItemInfoPathKey;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar1,&local_c1);
    JsonMap::getString(&local_a0,pJVar3,&local_c0);
    std::filesystem::__cxx11::path::path(&local_80,&local_a0,auto_format);
    std::filesystem::__cxx11::operator/((path *)local_58,(path *)&identifier[2].field_2,&local_80);
    std::filesystem::__cxx11::path::~path(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                       ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_28);
    pcVar1 = kModelPackageItemInfoNameKey;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,pcVar1,(allocator<char> *)(author.field_2._M_local_buf + 0xf));
    JsonMap::getString((string *)local_f8,pJVar3,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)(author.field_2._M_local_buf + 0xf));
    pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                       ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_28);
    pcVar1 = kModelPackageItemInfoAuthorKey;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,pcVar1,
               (allocator<char> *)(description.field_2._M_local_buf + 0xf));
    JsonMap::getString((string *)local_140,pJVar3,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)(description.field_2._M_local_buf + 0xf));
    pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                       ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_28);
    pcVar1 = kModelPackageItemInfoDescriptionKey;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,pcVar1,(allocator<char> *)(local_1c0 + 0x17));
    JsonMap::getString((string *)local_188,pJVar3,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_1c0 + 0x17));
    std::
    make_shared<MPL::detail::ModelPackageItemInfoImpl,std::__cxx11::string_const&,std::filesystem::__cxx11::path&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
               (path *)itemInfoEntry._M_t.
                       super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                       super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                       super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    std::
    make_shared<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::detail::ModelPackageItemInfoImpl>>
              ((shared_ptr<MPL::detail::ModelPackageItemInfoImpl> *)this);
    std::shared_ptr<MPL::detail::ModelPackageItemInfoImpl>::~shared_ptr
              ((shared_ptr<MPL::detail::ModelPackageItemInfoImpl> *)local_1c0);
    path._36_4_ = 1;
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_f8);
    std::filesystem::__cxx11::path::~path((path *)local_58);
  }
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_28);
  sVar4.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MPL::ModelPackageItemInfo>)
         sVar4.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ModelPackageItemInfo> ModelPackageImpl::findItem(const std::string& identifier) const
{
    auto itemInfoEntry = getItemInfoEntry(identifier);
    if (itemInfoEntry == nullptr) {
        return nullptr;
    }
    
    auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
    auto name = itemInfoEntry->getString(kModelPackageItemInfoNameKey);
    auto author = itemInfoEntry->getString(kModelPackageItemInfoAuthorKey);
    auto description = itemInfoEntry->getString(kModelPackageItemInfoDescriptionKey);
    
    return std::make_shared<ModelPackageItemInfo>(std::make_shared<ModelPackageItemInfoImpl>(identifier, path, name, author, description));
}